

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  Slice local_48;
  Slice local_38;
  Status local_28;
  char *local_20;
  char *reason_local;
  uint64_t bytes_local;
  Reader *this_local;
  
  local_20 = reason;
  reason_local = (char *)bytes;
  bytes_local = (uint64_t)this;
  Slice::Slice(&local_38,reason);
  Slice::Slice(&local_48);
  Status::Corruption(&local_28,&local_38,&local_48);
  ReportDrop(this,bytes,&local_28);
  Status::~Status(&local_28);
  return;
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason));
}